

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

bool google::protobuf::internal::TcParser::ChangeOneof
               (TcParseTableBase *table,FieldEntry *entry,uint32_t field_num,ParseContext *ctx,
               MessageLite *msg)

{
  ushort uVar1;
  uint32_t field_num_00;
  long *plVar2;
  Cord *this;
  uint32_t *puVar3;
  FieldEntry *pFVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  ArenaStringPtr *this_00;
  LogMessageDebugFatal local_30 [20];
  uint local_1c;
  
  puVar3 = (uint32_t *)((long)&msg->_vptr_MessageLite + (long)entry->has_idx);
  if (((ulong)puVar3 & 3) != 0) {
    AlignFail(puVar3);
  }
  field_num_00 = *puVar3;
  *puVar3 = field_num;
  bVar6 = true;
  if (field_num_00 != 0) {
    if (field_num_00 == field_num) {
      bVar6 = false;
    }
    else {
      pFVar4 = FindFieldEntry(table,field_num_00);
      uVar1 = pFVar4->type_card;
      if ((uVar1 & 7) == 6) {
        if ((uVar1 & 0x180) == 0) {
          this_00 = (ArenaStringPtr *)((long)&msg->_vptr_MessageLite + (ulong)pFVar4->offset);
          if (((ulong)this_00 & 7) == 0) {
            uVar5 = (msg->_internal_metadata_).ptr_;
            if ((uVar5 & 1) != 0) {
              uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
            }
            if (uVar5 != 0) {
              return true;
            }
            plVar2 = (long *)(this_00->tagged_ptr_).ptr_;
            if (plVar2 == (long *)0x0) {
              return true;
            }
            (**(code **)(*plVar2 + 8))();
            return true;
          }
          goto LAB_001569ef;
        }
        absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  (local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x68a);
        absl::lts_20240722::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                  (local_30,0x19,"message rep not handled: ");
        local_1c = (uVar1 & 0x1c0) >> 6;
        _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                  (local_30);
      }
      else {
        if ((uVar1 & 7) != 5) {
          return true;
        }
        uVar7 = (uVar1 & 0x1c0) >> 6;
        if (uVar7 == 2) {
          uVar5 = (msg->_internal_metadata_).ptr_;
          if ((uVar5 & 1) != 0) {
            uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
          }
          if (uVar5 != 0) {
            return true;
          }
          this_00 = (ArenaStringPtr *)((long)&msg->_vptr_MessageLite + (ulong)pFVar4->offset);
          if (((ulong)this_00 & 7) == 0) {
            this = (Cord *)(this_00->tagged_ptr_).ptr_;
            if (this == (Cord *)0x0) {
              return true;
            }
            absl::lts_20240722::Cord::~Cord(this);
            operator_delete(this,0x10);
            return true;
          }
LAB_001569ef:
          AlignFail(this_00);
        }
        if ((uVar1 & 0x1c0) == 0) {
          this_00 = (ArenaStringPtr *)((long)&msg->_vptr_MessageLite + (ulong)pFVar4->offset);
          if (((ulong)this_00 & 7) == 0) {
            ArenaStringPtr::Destroy(this_00);
            return true;
          }
          goto LAB_001569ef;
        }
        absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  (local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x67b);
        absl::lts_20240722::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                  (local_30,0x18,"string rep not handled: ");
        local_1c = uVar7;
        _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                  (local_30);
      }
      absl::lts_20240722::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal(local_30);
    }
  }
  return bVar6;
}

Assistant:

bool TcParser::ChangeOneof(const TcParseTableBase* table,
                           const TcParseTableBase::FieldEntry& entry,
                           uint32_t field_num, ParseContext* ctx,
                           MessageLite* msg) {
  // The _oneof_case_ value offset is stored in the has-bit index.
  uint32_t* oneof_case = &TcParser::RefAt<uint32_t>(msg, entry.has_idx);
  uint32_t current_case = *oneof_case;
  *oneof_case = field_num;

  if (current_case == 0) {
    // If the member is empty, we don't have anything to clear. Caller is
    // responsible for creating a new member object.
    return true;
  }
  if (current_case == field_num) {
    // If the member is already active, then it should be merged. We're done.
    return false;
  }
  // Look up the value that is already stored, and dispose of it if necessary.
  const FieldEntry* current_entry = FindFieldEntry(table, current_case);
  uint16_t current_kind = current_entry->type_card & field_layout::kFkMask;
  uint16_t current_rep = current_entry->type_card & field_layout::kRepMask;
  if (current_kind == field_layout::kFkString) {
    switch (current_rep) {
      case field_layout::kRepAString: {
        auto& field = RefAt<ArenaStringPtr>(msg, current_entry->offset);
        field.Destroy();
        break;
      }
      case field_layout::kRepCord: {
        if (msg->GetArena() == nullptr) {
          delete RefAt<absl::Cord*>(msg, current_entry->offset);
        }
        break;
      }
      case field_layout::kRepSString:
      case field_layout::kRepIString:
      default:
        ABSL_DLOG(FATAL) << "string rep not handled: "
                         << (current_rep >> field_layout::kRepShift);
        return true;
    }
  } else if (current_kind == field_layout::kFkMessage) {
    switch (current_rep) {
      case field_layout::kRepMessage:
      case field_layout::kRepGroup: {
        auto& field = RefAt<MessageLite*>(msg, current_entry->offset);
        if (!msg->GetArena()) {
          delete field;
        }
        break;
      }
      default:
        ABSL_DLOG(FATAL) << "message rep not handled: "
                         << (current_rep >> field_layout::kRepShift);
        break;
    }
  }
  return true;
}